

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  undefined4 in_register_0000000c;
  float *pfVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  allocator_type local_41;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  
  pfVar1 = (float *)CONCAT44(in_register_0000000c,w);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&display,(long)(y * x),&local_41);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1406,
             display.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  bVar3 = y < 1;
  if (0 < y) {
    lVar5 = 0;
    iVar2 = 0;
    do {
      if (0 < x) {
        uVar4 = 0;
        do {
          iVar6 = (int)lVar5 + (int)uVar4;
          fVar7 = display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0] - *pfVar1;
          fVar8 = -fVar7;
          if (-fVar7 <= fVar7) {
            fVar8 = fVar7;
          }
          if ((this->g_color_eps).m_data[0] < fVar8) {
LAB_0091d41e:
            anon_unknown_0::Output
                      ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[0],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[3],
                       (double)*pfVar1,(double)pfVar1[1],(double)pfVar1[2],(double)pfVar1[3]);
            goto LAB_0091d46e;
          }
          fVar7 = display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[1] - pfVar1[1];
          fVar8 = -fVar7;
          if (-fVar7 <= fVar7) {
            fVar8 = fVar7;
          }
          if ((this->g_color_eps).m_data[1] < fVar8) goto LAB_0091d41e;
          fVar7 = display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[2] - pfVar1[2];
          fVar8 = -fVar7;
          if (-fVar7 <= fVar7) {
            fVar8 = fVar7;
          }
          if ((this->g_color_eps).m_data[2] < fVar8) goto LAB_0091d41e;
          fVar7 = display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar6].m_data[3] - pfVar1[3];
          fVar8 = -fVar7;
          if (-fVar7 <= fVar7) {
            fVar8 = fVar7;
          }
          if ((this->g_color_eps).m_data[3] < fVar8) goto LAB_0091d41e;
          uVar4 = uVar4 + 1;
        } while ((uint)x != uVar4);
      }
      iVar2 = iVar2 + 1;
      lVar5 = lVar5 + (ulong)(uint)x;
      bVar3 = y <= iVar2;
    } while (iVar2 != y);
  }
LAB_0091d46e:
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4> display(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &display[0]);

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}